

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferParamValueIntToFloatConversion.cpp
# Opt level: O2

string * __thiscall
glcts::TextureBufferParamValueIntToFloatConversion::getComputeShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferParamValueIntToFloatConversion *this)

{
  ostream *poVar1;
  stringstream result;
  stringstream local_190 [16];
  ostream local_180;
  
  std::__cxx11::stringstream::stringstream(local_190);
  poVar1 = std::operator<<(&local_180,
                           "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nuniform highp samplerBuffer sampler_buffer;\n\nlayout(std430) buffer ComputeSSBO\n{\n    float value[];\n} computeSSBO;\n\nlayout (local_size_x = "
                          );
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", local_size_y = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,
                  ") in;\n\nvoid main(void)\n{\n    int index = int(gl_LocalInvocationID.x * gl_WorkGroupSize.y + gl_LocalInvocationID.y);\n\n    computeSSBO.value[index] = texelFetch( sampler_buffer, index ).x;\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferParamValueIntToFloatConversion::getComputeShaderCode()
{
	std::stringstream result;

	result << "${VERSION}\n"
			  "\n"
			  "${TEXTURE_BUFFER_REQUIRE}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "uniform highp samplerBuffer sampler_buffer;\n"
			  "\n"
			  "layout(std430) buffer ComputeSSBO\n"
			  "{\n"
			  "    float value[];\n"
			  "} computeSSBO;\n"
			  "\n"
			  "layout (local_size_x = "
		   << m_work_group_x_size << ", local_size_y = " << m_work_group_y_size
		   << ") in;\n"
			  "\n"
			  "void main(void)\n"
			  "{\n"
			  "    int index = int(gl_LocalInvocationID.x * gl_WorkGroupSize.y + gl_LocalInvocationID.y);\n"
			  "\n"
			  "    computeSSBO.value[index] = texelFetch( sampler_buffer, index ).x;\n"
			  "}\n";

	return result.str();
}